

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  char *__buf_00;
  buffer_appender<char> bVar1;
  ssize_t sVar2;
  format_error *this_00;
  undefined4 in_register_00000034;
  basic_format_specs<char> *in_R8;
  basic_string_view<char> s;
  
  bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
       in_register_00000034;
  bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = __fd;
  if (bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container ==
      (buffer<char> *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __buf_00 = (char *)strlen((char *)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                    .container);
  if (this->specs_ != (format_specs *)0x0) {
    s.size_ = (size_t)this->specs_;
    s.data_ = __buf_00;
    bVar1 = write<char,char,fmt::v7::detail::buffer_appender<char>>
                      ((detail *)
                       (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,bVar1,s,in_R8);
    (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    return (ssize_t)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  sVar2 = write(this,__fd,__buf_00,0);
  return sVar2;
}

Assistant:

void write(const Char* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? write(sv, *specs_) : write(sv);
    }
  }